

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O0

Info * re2::Prefilter::Info::Quest(Info *a)

{
  Info *this;
  Prefilter *this_00;
  Info *ab;
  Info *a_local;
  
  this = (Info *)operator_new(0x40);
  Info(this);
  this->is_exact_ = false;
  this_00 = (Prefilter *)operator_new(0x38);
  Prefilter(this_00,ALL);
  this->match_ = this_00;
  if (a != (Info *)0x0) {
    ~Info(a);
    operator_delete(a);
  }
  return this;
}

Assistant:

Prefilter::Info* Prefilter::Info::Quest(Info *a) {
  Info *ab = new Info();

  ab->is_exact_ = false;
  ab->match_ = new Prefilter(ALL);
  delete a;
  return ab;
}